

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O3

void __thiscall
DialogPrompt::DialogPrompt
          (DialogPrompt *this,string *dialogText,Color *textColor,uint charSize,float x,float y,
          Color *fillColor,Color *outlineColor,Vector2f *size)

{
  Text *this_00;
  RectangleShape *this_01;
  Font *font;
  Transformable *this_02;
  locale local_68 [8];
  Color *local_60;
  Color *local_58;
  String local_50;
  
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_001d19f0;
  this_02 = &(this->super_UIComponent).super_Transformable;
  local_60 = outlineColor;
  sf::Transformable::Transformable(this_02);
  (this->super_UIComponent).super_Transformable.field_0xa9 = 1;
  (this->super_UIComponent).super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__DialogPrompt_001d2280;
  (this->super_UIComponent).super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__DialogPrompt_001d22b8;
  this_00 = &this->text;
  sf::Text::Text(this_00);
  this_01 = &this->background;
  local_50.m_string._M_dataplus._M_p = (pointer)0x0;
  sf::RectangleShape::RectangleShape(this_01,(Vector2f *)&local_50);
  (this->optionChecks).super__Vector_base<CheckBox,_std::allocator<CheckBox>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optionChecks).super__Vector_base<CheckBox,_std::allocator<CheckBox>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optionChecks).super__Vector_base<CheckBox,_std::allocator<CheckBox>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = textColor;
  font = Board::getFont();
  sf::Text::setFont(this_00,font);
  std::locale::locale(local_68);
  sf::String::String(&local_50,dialogText,local_68);
  sf::Text::setString(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_50.m_string._M_dataplus._M_p != &local_50.m_string.field_2) {
    operator_delete(local_50.m_string._M_dataplus._M_p);
  }
  std::locale::~locale(local_68);
  sf::Text::setFillColor(this_00,local_58);
  sf::Text::setCharacterSize(this_00,charSize);
  sf::Transformable::setPosition(&(this->text).super_Transformable,10.0,5.0);
  sf::RectangleShape::setSize(this_01,size);
  sf::Shape::setFillColor(&this_01->super_Shape,fillColor);
  sf::Shape::setOutlineColor(&this_01->super_Shape,local_60);
  sf::Shape::setOutlineThickness(&this_01->super_Shape,-2.0);
  sf::Transformable::setPosition(&(this->background).super_Shape.super_Transformable,0.0,0.0);
  sf::Transformable::setPosition(this_02,x,y);
  (this->super_UIComponent).super_Transformable.field_0xa9 = 0;
  if (UserInterface::_dialogPrompts.
      super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      UserInterface::_dialogPrompts.
      super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_50.m_string._M_dataplus._M_p = (pointer)this;
    std::vector<DialogPrompt*,std::allocator<DialogPrompt*>>::_M_realloc_insert<DialogPrompt*>
              ((vector<DialogPrompt*,std::allocator<DialogPrompt*>> *)&UserInterface::_dialogPrompts
               ,(iterator)
                UserInterface::_dialogPrompts.
                super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
                super__Vector_impl_data._M_finish,(DialogPrompt **)&local_50);
  }
  else {
    *UserInterface::_dialogPrompts.
     super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
     super__Vector_impl_data._M_finish = this;
    UserInterface::_dialogPrompts.
    super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         UserInterface::_dialogPrompts.
         super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

DialogPrompt::DialogPrompt(const string& dialogText, const Color& textColor, unsigned int charSize, float x, float y, const Color& fillColor, const Color& outlineColor, const Vector2f& size) {
    text.setFont(Board::getFont());
    text.setString(dialogText);
    text.setFillColor(textColor);
    text.setCharacterSize(charSize);
    text.setPosition(10.0f, 5.0f);
    
    background.setSize(size);
    background.setFillColor(fillColor);
    background.setOutlineColor(outlineColor);
    background.setOutlineThickness(-2.0f);
    background.setPosition(0.0f, 0.0f);
    
    setPosition(x, y);
    visible = false;
    UserInterface::_dialogPrompts.push_back(this);
}